

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void test_colnam(FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  char **ttypecopy;
  ColName **cols;
  char *q;
  char *p;
  int n;
  int i;
  FitsHdu *hduptr_local;
  FILE *out_local;
  
  iVar1 = hduptr->ncols;
  if (0 < iVar1) {
    __ptr = malloc((long)iVar1 << 3);
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      pvVar3 = malloc(0x47);
      *(void **)((long)__ptr + (long)p._4_4_ * 8) = pvVar3;
      strcpy(*(char **)((long)__ptr + (long)p._4_4_ * 8),ttype[p._4_4_]);
    }
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      q = ttype[p._4_4_];
      cols = *(ColName ***)((long)__ptr + (long)p._4_4_ * 8);
      sVar4 = strlen(q);
      if (sVar4 == 0) {
        sprintf(errmes,"Column #%d has no name (No TTYPE%d keyword).",(ulong)(p._4_4_ + 1),
                (ulong)(p._4_4_ + 1));
        wrtwrn(out,errmes,0);
      }
      else {
        for (; *q != '\0'; q = q + 1) {
          if (((('z' < *q) || (*q < 'a')) && (('Z' < *q || (*q < 'A')))) &&
             ((('9' < *q || (*q < '0')) && (*q != '_')))) {
            if (*q == '&') {
              sprintf(errmes,
                      "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')"
                      ,(ulong)(p._4_4_ + 1),(ulong)(p._4_4_ + 1),(ulong)(uint)(int)*q);
              wrtwrn(out,errmes,0);
            }
            else {
              sprintf(errmes,
                      "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\"."
                      ,(ulong)(p._4_4_ + 1),ttype[p._4_4_],(ulong)(uint)(int)*q);
              wrtwrn(out,errmes,0);
            }
          }
          if ((*q < '{') || ('`' < *q)) {
            iVar2 = toupper((int)*q);
            *(char *)cols = (char)iVar2;
          }
          cols = (ColName **)((long)cols + 1);
        }
      }
    }
    pvVar3 = calloc((long)iVar1,8);
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      pvVar5 = malloc(0x10);
      *(void **)((long)pvVar3 + (long)p._4_4_ * 8) = pvVar5;
      **(undefined8 **)((long)pvVar3 + (long)p._4_4_ * 8) =
           *(undefined8 *)((long)__ptr + (long)p._4_4_ * 8);
      *(int *)(*(long *)((long)pvVar3 + (long)p._4_4_ * 8) + 8) = p._4_4_ + 1;
    }
    qsort(pvVar3,(long)iVar1,8,compcol);
    for (p._4_4_ = 0; p._4_4_ < iVar1 + -1; p._4_4_ = p._4_4_ + 1) {
      sVar4 = strlen((char *)**(undefined8 **)((long)pvVar3 + (long)p._4_4_ * 8));
      if ((sVar4 != 0) &&
         (iVar2 = strcmp((char *)**(undefined8 **)((long)pvVar3 + (long)p._4_4_ * 8),
                         (char *)**(undefined8 **)((long)pvVar3 + (long)(p._4_4_ + 1) * 8)),
         iVar2 == 0)) {
        sprintf(errmes,"Columns #%d, %s and #%d, %s are not unique (case insensitive).",
                (ulong)*(uint *)(*(long *)((long)pvVar3 + (long)p._4_4_ * 8) + 8),
                ttype[*(int *)(*(long *)((long)pvVar3 + (long)p._4_4_ * 8) + 8) + -1],
                (ulong)*(uint *)(*(long *)((long)pvVar3 + (long)(p._4_4_ + 1) * 8) + 8),
                ttype[*(int *)(*(long *)((long)pvVar3 + (long)(p._4_4_ + 1) * 8) + 8) + -1]);
        wrtwrn(out,errmes,0);
      }
    }
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      free(*(void **)((long)pvVar3 + (long)p._4_4_ * 8));
      free(*(void **)((long)__ptr + (long)p._4_4_ * 8));
    }
    free(pvVar3);
    free(__ptr);
  }
  return;
}

Assistant:

void test_colnam(FILE *out, 
		FitsHdu *hduptr)
{ 
    int i,n; 
    char *p, *q;
    ColName **cols; 
    char **ttypecopy;

    n = hduptr->ncols; 

    if(n <= 0) return;
    /* make a local working copy of ttype */
    ttypecopy = (char **)malloc(n*sizeof(char *));
    for (i = 0; i < n; i++) { 
        ttypecopy[i] = (char *)malloc(FLEN_VALUE*sizeof(char));
        strcpy(ttypecopy[i],ttype[i]);
    } 

    /* check whether there are any other non ASCII-text characters 
      (FITS standard R14). Also "uppercase" the working copies. */
    for (i = 0; i < n; i++) { 
        p = ttype[i];
        q = ttypecopy[i];
        if(!strlen(p)) { 
            sprintf(errmes,
            "Column #%d has no name (No TTYPE%d keyword).",i+1, i+1);
            wrtwrn(out,errmes,0);
            continue;
        }


/*      disable this check (it was only a warning) 
        if( (*p  > 'z' || *p < 'a') && (*p > 'Z' || *p <'A') 
                && (*p > '9' || *p < '0') ) { 
            sprintf(errmes,"Column #%d: Name \"%s\" does not begin with a letter or a digit.",i+1,ttype[i]);
            wrtwrn(out,errmes,1);
        }  
*/
        while(*p != '\0') {
            if ((*p > 'z' || *p < 'a') && (*p > 'Z' || *p < 'A')
                 && (*p > '9' || *p < '0') && (*p != '_')) {
               if (*p == '&') {
                  sprintf(errmes,
                  "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')",
                  i+1,i+1,*p);
                  wrtwrn(out,errmes,0);
               } else {
                  sprintf(errmes,
                  "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\".",
                  i+1,ttype[i],*p);
                  wrtwrn(out,errmes,0);
               }
            }
            if(*p <= 'z' || *p >= 'a') *q = toupper(*p);
            p++; q++;
        }
    }

    cols = (ColName **)calloc(n, sizeof(ColName *));
    for (i=0; i < n; i++) { 
        cols[i] = (ColName *)malloc(sizeof(ColName));
	cols[i]->name = ttypecopy[i];
	cols[i]->index = i+1; 
    }
    
    /* sort the column name in the ascending order of name field*/ 
    qsort(cols, n, sizeof(ColName *), compcol); 

    /* Check the duplication of the column name */ 
    for (i = 0; i < n-1; i++) { 
        if(!strlen(cols[i]->name)) continue;

/*      disable this warning
        if(!strncmp(cols[i]->name,cols[i+1]->name,16)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique within first 16 characters(case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,1);
        }
*/

        if(!strcmp(cols[i]->name,cols[i+1]->name)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique (case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,0);
        }
    }  
    for (i = 0; i < n; i++) { free(cols[i]); free(ttypecopy[i]);}
    free(cols); free(ttypecopy);
    return;
}